

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void vmaDestroyImage(VmaAllocator allocator,VkImage image,VmaAllocation allocation)

{
  VkAllocationCallbacks *pVVar1;
  VmaAllocation allocation_local;
  
  if (image != (VkImage)0x0 || allocation != (VmaAllocation)0x0) {
    allocation_local = allocation;
    if (image != (VkImage)0x0) {
      pVVar1 = (VkAllocationCallbacks *)0x0;
      if (allocator->m_AllocationCallbacksSpecified != false) {
        pVVar1 = &allocator->m_AllocationCallbacks;
      }
      (*(allocator->m_VulkanFunctions).vkDestroyImage)(allocator->m_hDevice,image,pVVar1);
    }
    if (allocation != (VmaAllocation)0x0) {
      VmaAllocator_T::FreeMemory(allocator,1,&allocation_local);
    }
  }
  return;
}

Assistant:

VMA_CALL_PRE void VMA_CALL_POST vmaDestroyImage(
    VmaAllocator VMA_NOT_NULL allocator,
    VkImage VMA_NULLABLE_NON_DISPATCHABLE image,
    VmaAllocation VMA_NULLABLE allocation)
{
    VMA_ASSERT(allocator);

    if(image == VK_NULL_HANDLE && allocation == VK_NULL_HANDLE)
    {
        return;
    }

    VMA_DEBUG_LOG("vmaDestroyImage");

    VMA_DEBUG_GLOBAL_MUTEX_LOCK

    if(image != VK_NULL_HANDLE)
    {
        (*allocator->GetVulkanFunctions().vkDestroyImage)(allocator->m_hDevice, image, allocator->GetAllocationCallbacks());
    }
    if(allocation != VK_NULL_HANDLE)
    {
        allocator->FreeMemory(
            1, // allocationCount
            &allocation);
    }
}